

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

CZString * __thiscall Json::Value::CZString::operator=(CZString *this,CZString *other)

{
  CZString *in_RSI;
  CZString *in_RDI;
  
  swap(in_RSI,in_RDI);
  return in_RDI;
}

Assistant:

Value::CZString& Value::CZString::operator=(CZString other) {
  swap(other);
  return *this;
}